

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  tm *__tp;
  void *pvVar4;
  char *extramsg;
  size_t l;
  lua_Number lVar5;
  char cc [4];
  time_t t;
  char buff [200];
  luaL_Buffer b;
  char local_2124;
  char local_2123;
  undefined1 local_2122;
  long local_2120;
  char local_2118 [200];
  luaL_Buffer local_2050;
  
  pcVar3 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    local_2120 = time((time_t *)0x0);
  }
  else {
    lVar5 = luaL_checknumber(L,2);
    local_2120 = (long)lVar5;
  }
  if (*pcVar3 == '!') {
    __tp = gmtime(&local_2120);
    pcVar3 = pcVar3 + 1;
  }
  else {
    __tp = localtime(&local_2120);
  }
  if (__tp == (tm *)0x0) {
    lua_pushnil(L);
  }
  else if (((*pcVar3 == '*') && (pcVar3[1] == 't')) && (pcVar3[2] == '\0')) {
    lua_createtable(L,0,9);
    lua_pushinteger(L,(long)__tp->tm_sec);
    lua_setfield(L,-2,"sec");
    lua_pushinteger(L,(long)__tp->tm_min);
    lua_setfield(L,-2,"min");
    lua_pushinteger(L,(long)__tp->tm_hour);
    lua_setfield(L,-2,"hour");
    lua_pushinteger(L,(long)__tp->tm_mday);
    lua_setfield(L,-2,"day");
    lua_pushinteger(L,(long)__tp->tm_mon + 1);
    lua_setfield(L,-2,"month");
    lua_pushinteger(L,(long)__tp->tm_year + 0x76c);
    lua_setfield(L,-2,"year");
    lua_pushinteger(L,(long)__tp->tm_wday + 1);
    lua_setfield(L,-2,"wday");
    lua_pushinteger(L,(long)__tp->tm_yday + 1);
    lua_setfield(L,-2,"yday");
    if (-1 < __tp->tm_isdst) {
      lua_pushboolean(L,__tp->tm_isdst);
      lua_setfield(L,-2,"isdst");
    }
  }
  else {
    local_2124 = '%';
    luaL_buffinit(L,&local_2050);
LAB_00118e56:
    while( true ) {
      cVar1 = *pcVar3;
      if (cVar1 != '%') break;
      cVar1 = pcVar3[1];
      if (cVar1 == '\0') {
LAB_00118ee0:
        pcVar3 = pcVar3 + 1;
        extramsg = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",pcVar3);
        luaL_argerror(L,1,extramsg);
      }
      else {
        pvVar4 = memchr("aAbBcdHIjmMpSUwWxXyYz%",(int)cVar1,0x17);
        if (pvVar4 == (void *)0x0) goto LAB_00118ee0;
        local_2122 = 0;
        pcVar3 = pcVar3 + 2;
        local_2123 = cVar1;
      }
      l = strftime(local_2118,200,&local_2124,__tp);
      luaL_addlstring(&local_2050,local_2118,l);
    }
    if (cVar1 != '\0') {
      if (local_2050.size <= local_2050.n) {
        luaL_prepbuffsize(&local_2050,1);
        cVar1 = *pcVar3;
      }
      pcVar3 = pcVar3 + 1;
      local_2050.b[local_2050.n] = cVar1;
      local_2050.n = local_2050.n + 1;
      goto LAB_00118e56;
    }
    luaL_pushresult(&local_2050);
  }
  return 1;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip `!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    lua_pushnil(L);
  else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  }
  else {
    char cc[4];
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* no conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char buff[200];  /* should be big enough for any conversion result */
        s = checkoption(L, s + 1, cc);
        reslen = strftime(buff, sizeof(buff), cc, stm);
        luaL_addlstring(&b, buff, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}